

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
wasm::Builder::makeDataSegment
          (Name name,Name memory,bool isPassive,Expression *offset,char *init,Address size)

{
  undefined8 *puVar1;
  unsigned_long __n2;
  undefined7 in_register_00000081;
  pointer *__ptr;
  size_type in_stack_00000018;
  
  puVar1 = (undefined8 *)operator_new(0x50);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  *(undefined8 **)name.super_IString.str._M_len = puVar1;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = memory.super_IString.str._M_len;
  puVar1[3] = memory.super_IString.str._M_str;
  puVar1[4] = CONCAT71(in_register_00000081,isPassive);
  *(char *)(puVar1 + 5) = (char)offset;
  puVar1[6] = init;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)(puVar1 + 7),in_stack_00000018);
  if (in_stack_00000018 != 0) {
    memmove((((vector<char,_std::allocator<char>_> *)(puVar1 + 7))->
            super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start,(void *)size.addr,in_stack_00000018);
  }
  return (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
         name.super_IString.str._M_len;
}

Assistant:

static std::unique_ptr<DataSegment>
  makeDataSegment(Name name = "",
                  Name memory = "",
                  bool isPassive = false,
                  Expression* offset = nullptr,
                  const char* init = "",
                  Address size = 0) {
    auto seg = std::make_unique<DataSegment>();
    seg->name = name;
    seg->memory = memory;
    seg->isPassive = isPassive;
    seg->offset = offset;
    seg->data.resize(size);
    std::copy_n(init, size, seg->data.begin());
    return seg;
  }